

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::AnimationRule::AnimationRuleSet>::copyAppend
          (QGenericArrayOps<QCss::AnimationRule::AnimationRuleSet> *this,AnimationRuleSet *b,
          AnimationRuleSet *e)

{
  qsizetype *pqVar1;
  AnimationRuleSet *pAVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pAVar2 = (this->super_QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet>).size;
      pAVar2[lVar3].keyFrame = b->keyFrame;
      pDVar4 = (b->declarations).d.d;
      pAVar2[lVar3].declarations.d.d = pDVar4;
      pAVar2[lVar3].declarations.d.ptr = (b->declarations).d.ptr;
      pAVar2[lVar3].declarations.d.size = (b->declarations).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }